

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O2

void __thiscall
QGraphicsLayoutItemPrivate::setSizeComponent
          (QGraphicsLayoutItemPrivate *this,SizeHint which,SizeComponent component,qreal value)

{
  double dVar1;
  QGraphicsLayoutItem *pQVar2;
  QSizeF *pQVar3;
  
  pQVar2 = this->q_ptr;
  ensureUserSizeHints(this);
  pQVar3 = (QSizeF *)&this->userSizeHints->ht;
  if (component == Width) {
    pQVar3 = this->userSizeHints;
  }
  dVar1 = pQVar3[which].wd;
  if ((dVar1 == value) && (!NAN(dVar1) && !NAN(value))) {
    return;
  }
  pQVar3[which].wd = value;
  (*pQVar2->_vptr_QGraphicsLayoutItem[4])(pQVar2);
  return;
}

Assistant:

void QGraphicsLayoutItemPrivate::setSizeComponent(
    Qt::SizeHint which, SizeComponent component, qreal value)
{
    Q_Q(QGraphicsLayoutItem);
    ensureUserSizeHints();
    qreal &userValue = (component == Width)
        ? userSizeHints[which].rwidth()
        : userSizeHints[which].rheight();
    if (value == userValue)
        return;
    userValue = value;
    q->updateGeometry();
}